

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

int lws_mqtt_pconsume(lws_mqtt_parser_t *par,int consumed)

{
  int consumed_local;
  lws_mqtt_parser_t *par_local;
  
  par->consumed = consumed + par->consumed;
  if (par->props_len < par->consumed) {
    par_local._4_4_ = -1;
  }
  else if (par->consumed < par->props_len) {
    par->state = LMQCPP_PROP_ID_VBI;
    par_local._4_4_ = 0;
  }
  else if (((""[(int)(uint)par->packet_type_flags >> 4] & 0x80) == 0) ||
          (((int)(uint)par->packet_type_flags >> 4 == 3 && ((par->packet_type_flags & 6) == 0)))) {
    par->state = LMQCPP_IDLE;
    par_local._4_4_ = 0;
  }
  else {
    par->state = LMQCPP_PAYLOAD;
    par_local._4_4_ = 0;
  }
  return par_local._4_4_;
}

Assistant:

static int
lws_mqtt_pconsume(lws_mqtt_parser_t *par, int consumed)
{
	par->consumed += consumed;

	if (par->consumed > par->props_len)
		return -1;

	/* more properties coming */

	if (par->consumed < par->props_len) {
		par->state = LMQCPP_PROP_ID_VBI;
		return 0;
	}

	/* properties finished: are we headed for payload or idle? */

	if ((map_flags[ctl_pkt_type(par)] & LMQCP_LUT_FLAG_PAYLOAD) &&
		/* A PUBLISH packet MUST NOT contain a Packet Identifier if
		 * its QoS value is set to 0 [MQTT-2.2.1-2]. */
	    (ctl_pkt_type(par) != LMQCP_PUBLISH ||
	     (par->packet_type_flags & 6))) {
		par->state = LMQCPP_PAYLOAD;
		return 0;
	}

	par->state = LMQCPP_IDLE;

	return 0;
}